

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbcEncrypt.c
# Opt level: O3

void encryptInPlace(ThreefishKey_t *key,uint64_t *chain,uint64_t *plain_text,uint64_t num_blocks)

{
  ulong *puVar1;
  ulong *puVar2;
  u64b_t uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong *extraout_RDX;
  ulong uVar10;
  ulong uVar11;
  ulong *in;
  ulong *puVar12;
  ulong uVar13;
  ulong uStack_b0;
  ulong uStack_98;
  ulong uStack_90;
  undefined8 uStack_70;
  undefined8 uStack_68;
  uint uStack_60;
  uint uStack_5c;
  uint uStack_58;
  uint uStack_54;
  
  uVar3 = key->stateSize;
  if (uVar3 == 0x400) {
    *plain_text = *plain_text ^ *chain;
    plain_text[1] = plain_text[1] ^ chain[1];
    plain_text[2] = plain_text[2] ^ chain[2];
    plain_text[3] = plain_text[3] ^ chain[3];
    plain_text[4] = plain_text[4] ^ chain[4];
    plain_text[5] = plain_text[5] ^ chain[5];
    plain_text[6] = plain_text[6] ^ chain[6];
    plain_text[7] = plain_text[7] ^ chain[7];
    plain_text[8] = plain_text[8] ^ chain[8];
    plain_text[9] = plain_text[9] ^ chain[9];
    plain_text[10] = plain_text[10] ^ chain[10];
    plain_text[0xb] = plain_text[0xb] ^ chain[0xb];
    plain_text[0xc] = plain_text[0xc] ^ chain[0xc];
    plain_text[0xd] = plain_text[0xd] ^ chain[0xd];
    plain_text[0xe] = plain_text[0xe] ^ chain[0xe];
    plain_text[0xf] = plain_text[0xf] ^ chain[0xf];
    if (num_blocks << 4 != 0) {
      uVar11 = 0;
      do {
        if (uVar11 != 0) {
          *(uint *)plain_text = (uint)plain_text[-0x10] ^ (uint)*plain_text;
          *(uint *)((long)plain_text + 4) =
               *(uint *)((long)plain_text + -0x7c) ^ *(uint *)((long)plain_text + 4);
          *(uint *)(plain_text + 1) = (uint)plain_text[-0xf] ^ (uint)plain_text[1];
          *(uint *)((long)plain_text + 0xc) =
               *(uint *)((long)plain_text + -0x74) ^ *(uint *)((long)plain_text + 0xc);
          *(uint *)(plain_text + 2) = (uint)plain_text[2] ^ (uint)plain_text[-0xe];
          *(uint *)((long)plain_text + 0x14) =
               *(uint *)((long)plain_text + 0x14) ^ *(uint *)((long)plain_text + -0x6c);
          *(uint *)(plain_text + 3) = (uint)plain_text[3] ^ (uint)plain_text[-0xd];
          *(uint *)((long)plain_text + 0x1c) =
               *(uint *)((long)plain_text + 0x1c) ^ *(uint *)((long)plain_text + -100);
          *(uint *)(plain_text + 4) = (uint)plain_text[4] ^ (uint)plain_text[-0xc];
          *(uint *)((long)plain_text + 0x24) =
               *(uint *)((long)plain_text + 0x24) ^ *(uint *)((long)plain_text + -0x5c);
          *(uint *)(plain_text + 5) = (uint)plain_text[5] ^ (uint)plain_text[-0xb];
          *(uint *)((long)plain_text + 0x2c) =
               *(uint *)((long)plain_text + 0x2c) ^ *(uint *)((long)plain_text + -0x54);
          *(uint *)(plain_text + 6) = (uint)plain_text[6] ^ (uint)plain_text[-10];
          *(uint *)((long)plain_text + 0x34) =
               *(uint *)((long)plain_text + 0x34) ^ *(uint *)((long)plain_text + -0x4c);
          *(uint *)(plain_text + 7) = (uint)plain_text[7] ^ (uint)plain_text[-9];
          *(uint *)((long)plain_text + 0x3c) =
               *(uint *)((long)plain_text + 0x3c) ^ *(uint *)((long)plain_text + -0x44);
          *(uint *)(plain_text + 8) = (uint)plain_text[8] ^ (uint)plain_text[-8];
          *(uint *)((long)plain_text + 0x44) =
               *(uint *)((long)plain_text + 0x44) ^ *(uint *)((long)plain_text + -0x3c);
          *(uint *)(plain_text + 9) = (uint)plain_text[9] ^ (uint)plain_text[-7];
          *(uint *)((long)plain_text + 0x4c) =
               *(uint *)((long)plain_text + 0x4c) ^ *(uint *)((long)plain_text + -0x34);
          *(uint *)(plain_text + 10) = (uint)plain_text[10] ^ (uint)plain_text[-6];
          *(uint *)((long)plain_text + 0x54) =
               *(uint *)((long)plain_text + 0x54) ^ *(uint *)((long)plain_text + -0x2c);
          *(uint *)(plain_text + 0xb) = (uint)plain_text[0xb] ^ (uint)plain_text[-5];
          *(uint *)((long)plain_text + 0x5c) =
               *(uint *)((long)plain_text + 0x5c) ^ *(uint *)((long)plain_text + -0x24);
          *(uint *)(plain_text + 0xc) = (uint)plain_text[0xc] ^ (uint)plain_text[-4];
          *(uint *)((long)plain_text + 100) =
               *(uint *)((long)plain_text + 100) ^ *(uint *)((long)plain_text + -0x1c);
          *(uint *)(plain_text + 0xd) = (uint)plain_text[0xd] ^ (uint)plain_text[-3];
          *(uint *)((long)plain_text + 0x6c) =
               *(uint *)((long)plain_text + 0x6c) ^ *(uint *)((long)plain_text + -0x14);
          *(uint *)(plain_text + 0xe) = (uint)plain_text[0xe] ^ (uint)plain_text[-2];
          *(uint *)((long)plain_text + 0x74) =
               *(uint *)((long)plain_text + 0x74) ^ *(uint *)((long)plain_text + -0xc);
          *(uint *)(plain_text + 0xf) = (uint)plain_text[0xf] ^ (uint)plain_text[-1];
          *(uint *)((long)plain_text + 0x7c) =
               *(uint *)((long)plain_text + 0x7c) ^ *(uint *)((long)plain_text + -4);
        }
        threefishEncryptBlockWords(key,plain_text,plain_text);
        uVar11 = uVar11 + 0x10;
        plain_text = plain_text + 0x10;
      } while (uVar11 < num_blocks << 4);
    }
    return;
  }
  if (uVar3 == 0x200) {
    *plain_text = *plain_text ^ *chain;
    plain_text[1] = plain_text[1] ^ chain[1];
    plain_text[2] = plain_text[2] ^ chain[2];
    plain_text[3] = plain_text[3] ^ chain[3];
    plain_text[4] = plain_text[4] ^ chain[4];
    plain_text[5] = plain_text[5] ^ chain[5];
    plain_text[6] = plain_text[6] ^ chain[6];
    plain_text[7] = plain_text[7] ^ chain[7];
    if (num_blocks << 3 != 0) {
      uVar11 = 0;
      do {
        if (uVar11 != 0) {
          *(uint *)plain_text = (uint)plain_text[-8] ^ (uint)*plain_text;
          *(uint *)((long)plain_text + 4) =
               *(uint *)((long)plain_text + -0x3c) ^ *(uint *)((long)plain_text + 4);
          *(uint *)(plain_text + 1) = (uint)plain_text[-7] ^ (uint)plain_text[1];
          *(uint *)((long)plain_text + 0xc) =
               *(uint *)((long)plain_text + -0x34) ^ *(uint *)((long)plain_text + 0xc);
          *(uint *)(plain_text + 2) = (uint)plain_text[2] ^ (uint)plain_text[-6];
          *(uint *)((long)plain_text + 0x14) =
               *(uint *)((long)plain_text + 0x14) ^ *(uint *)((long)plain_text + -0x2c);
          *(uint *)(plain_text + 3) = (uint)plain_text[3] ^ (uint)plain_text[-5];
          *(uint *)((long)plain_text + 0x1c) =
               *(uint *)((long)plain_text + 0x1c) ^ *(uint *)((long)plain_text + -0x24);
          *(uint *)(plain_text + 4) = (uint)plain_text[4] ^ (uint)plain_text[-4];
          *(uint *)((long)plain_text + 0x24) =
               *(uint *)((long)plain_text + 0x24) ^ *(uint *)((long)plain_text + -0x1c);
          *(uint *)(plain_text + 5) = (uint)plain_text[5] ^ (uint)plain_text[-3];
          *(uint *)((long)plain_text + 0x2c) =
               *(uint *)((long)plain_text + 0x2c) ^ *(uint *)((long)plain_text + -0x14);
          *(uint *)(plain_text + 6) = (uint)plain_text[6] ^ (uint)plain_text[-2];
          *(uint *)((long)plain_text + 0x34) =
               *(uint *)((long)plain_text + 0x34) ^ *(uint *)((long)plain_text + -0xc);
          *(uint *)(plain_text + 7) = (uint)plain_text[7] ^ (uint)plain_text[-1];
          *(uint *)((long)plain_text + 0x3c) =
               *(uint *)((long)plain_text + 0x3c) ^ *(uint *)((long)plain_text + -4);
        }
        threefishEncryptBlockWords(key,plain_text,plain_text);
        uVar11 = uVar11 + 8;
        plain_text = plain_text + 8;
      } while (uVar11 < num_blocks << 3);
    }
    return;
  }
  if (uVar3 != 0x100) {
    encryptInPlace_cold_1();
    if (num_blocks << 2 != 0) {
      uStack_70 = 0;
      uStack_68 = 0;
      uVar13 = 0;
      uVar11 = 0;
      uStack_b0 = 0;
      uStack_90 = 0;
      uStack_98 = 0;
      uStack_60 = 0;
      uStack_5c = 0;
      uStack_58 = 0;
      uStack_54 = 0;
      in = extraout_RDX;
      do {
        uVar8 = extraout_RDX[uVar13];
        uVar9 = (extraout_RDX + uVar13)[1];
        uVar4 = extraout_RDX[uVar13 + 2];
        uVar5 = extraout_RDX[uVar13 + 3];
        threefishDecryptBlockWords(key,in,in);
        puVar12 = in + 3;
        if ((uVar13 & 4) == 0) {
          uStack_60 = (uint)uVar8;
          uStack_5c = (uint)(uVar8 >> 0x20);
          uStack_58 = (uint)uVar9;
          uStack_54 = (uint)(uVar9 >> 0x20);
          uVar11 = uVar5;
          uStack_b0 = uVar4;
          if (uVar13 == 0) {
            *extraout_RDX = *extraout_RDX ^ *chain;
            extraout_RDX[1] = extraout_RDX[1] ^ chain[1];
            extraout_RDX[2] = extraout_RDX[2] ^ chain[2];
            uVar10 = chain[3];
            puVar12 = extraout_RDX + 3;
          }
          else {
            puVar1 = extraout_RDX + uVar13;
            uVar6 = *(uint *)((long)puVar1 + 4);
            uVar4 = puVar1[1];
            uVar7 = *(uint *)((long)puVar1 + 0xc);
            puVar2 = extraout_RDX + uVar13;
            *(uint *)puVar2 = (uint)*puVar1 ^ (uint)uStack_70;
            *(uint *)((long)puVar2 + 4) = uVar6 ^ uStack_70._4_4_;
            *(uint *)(puVar2 + 1) = (uint)uVar4 ^ (uint)uStack_68;
            *(uint *)((long)puVar2 + 0xc) = uVar7 ^ uStack_68._4_4_;
            extraout_RDX[uVar13 + 2] = extraout_RDX[uVar13 + 2] ^ uStack_98;
            uVar10 = uStack_90;
          }
        }
        else {
          puVar1 = extraout_RDX + uVar13;
          uVar6 = *(uint *)((long)puVar1 + 4);
          uVar10 = puVar1[1];
          uVar7 = *(uint *)((long)puVar1 + 0xc);
          puVar2 = extraout_RDX + uVar13;
          *(uint *)puVar2 = (uint)*puVar1 ^ uStack_60;
          *(uint *)((long)puVar2 + 4) = uVar6 ^ uStack_5c;
          *(uint *)(puVar2 + 1) = (uint)uVar10 ^ uStack_58;
          *(uint *)((long)puVar2 + 0xc) = uVar7 ^ uStack_54;
          extraout_RDX[uVar13 + 2] = extraout_RDX[uVar13 + 2] ^ uStack_b0;
          uVar10 = uVar11;
          uStack_98 = uVar4;
          uStack_90 = uVar5;
          uStack_70 = uVar8;
          uStack_68 = uVar9;
        }
        *puVar12 = *puVar12 ^ uVar10;
        uVar13 = uVar13 + 4;
        in = in + 4;
      } while (uVar13 < num_blocks << 2);
    }
    return;
  }
  cbc256Encrypt(key,chain,plain_text,num_blocks);
  return;
}

Assistant:

void encryptInPlace(ThreefishKey_t* key,
                    const uint64_t* chain,
                    uint64_t* plain_text,
                    const uint64_t num_blocks)
{
    pd2("encryptInPlace(key:%lu, chain:%lu, plain_text:%lu, num_blocks:%lu)\n",
        key->key[0],
        chain[0],
        plain_text[0],
        num_blocks);

    switch(key->stateSize) //call the corresponding cbc Encrypt function
    {
        case 256: cbc256Encrypt(key, chain, plain_text, num_blocks);
        break;
        case 512: cbc512Encrypt(key, chain, plain_text, num_blocks);
        break;
        case 1024: cbc1024Encrypt(key, chain, plain_text, num_blocks);
        break;
        default:
        {
            perror("Invalid state size cannot continue\n");
            exit(9);
        }
        break;
    }
}